

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_extcomplex_str
              (lys_module *module,lys_ext_instance_complex *ext,char *arg_name,char *parent_name,
              char *value,int parent_stmt,LY_STMT stmt)

{
  long *plVar1;
  char **ppcVar2;
  void *pvVar3;
  LY_ERR *pLVar4;
  lyext_substmt *local_60;
  lyext_substmt *info;
  void *reallocated;
  char ***p;
  char **str;
  int c;
  int parent_stmt_local;
  char *value_local;
  char *parent_name_local;
  char *arg_name_local;
  lys_ext_instance_complex *ext_local;
  lys_module *module_local;
  
  reallocated = (void *)0x0;
  str._0_4_ = 0;
  str._4_4_ = parent_stmt;
  _c = value;
  value_local = parent_name;
  parent_name_local = arg_name;
  arg_name_local = (char *)ext;
  ext_local = (lys_ext_instance_complex *)module;
  if ((stmt == LY_STMT_PREFIX) && (parent_stmt == 3)) {
    plVar1 = (long *)lys_ext_complex_get_substmt(LY_STMT_BELONGSTO,ext,&local_60);
    if (local_60->cardinality < LY_STMT_CARD_SOME) {
      p = (char ***)(plVar1 + 1);
    }
    else {
      str._0_4_ = 0;
      while (*(long *)(*plVar1 + (long)((int)str + 1) * 8) != 0) {
        str._0_4_ = (int)str + 1;
      }
      p = (char ***)plVar1[1];
      reallocated = plVar1;
    }
    ppcVar2 = (char **)lydict_insert_zc((ly_ctx *)ext_local->def,_c);
    p[(int)str] = ppcVar2;
  }
  else {
    p = (char ***)lys_ext_complex_get_substmt(stmt,ext,&local_60);
    if (p == (char ***)0x0) {
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,parent_name_local,value_local);
      free(_c);
      return 1;
    }
    if ((local_60->cardinality < LY_STMT_CARD_SOME) && (*p != (char **)0x0)) {
      ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,parent_name_local,value_local);
      free(_c);
      return 1;
    }
    if (LY_STMT_CARD_MAND < local_60->cardinality) {
      reallocated = p;
      if (*p == (char **)0x0) {
        pvVar3 = calloc(2,8);
        *(void **)reallocated = pvVar3;
        if (stmt == LY_STMT_BELONGSTO) {
          pvVar3 = calloc(2,8);
          *(void **)((long)reallocated + 8) = pvVar3;
        }
        else if (stmt == LY_STMT_ARGUMENT) {
          pvVar3 = calloc(2,1);
          *(void **)((long)reallocated + 8) = pvVar3;
          **(undefined1 **)((long)reallocated + 8) = 2;
        }
      }
      else {
        for (str._0_4_ = 0; (*p)[(int)str] != (char *)0x0; str._0_4_ = (int)str + 1) {
        }
      }
      p = *reallocated;
    }
    ppcVar2 = (char **)lydict_insert_zc((ly_ctx *)ext_local->def,_c);
    p[(int)str] = ppcVar2;
    if ((int)str != 0) {
      info = (lyext_substmt *)realloc(*reallocated,(long)((int)str + 2) << 3);
      if (info == (lyext_substmt *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
        lydict_remove((ly_ctx *)ext_local->def,*(char **)(*reallocated + (long)(int)str * 8));
        *(undefined8 *)(*reallocated + (long)(int)str * 8) = 0;
        return 1;
      }
      *(lyext_substmt **)reallocated = info;
      *(undefined8 *)(*reallocated + (long)((int)str + 1) * 8) = 0;
      if (stmt == LY_STMT_BELONGSTO) {
        info = (lyext_substmt *)realloc(*(void **)((long)reallocated + 8),(long)((int)str + 2) << 3)
        ;
        if (info == (lyext_substmt *)0x0) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
          lydict_remove((ly_ctx *)ext_local->def,
                        *(char **)(*(long *)((long)reallocated + 8) + (long)(int)str * 8));
          *(undefined8 *)(*(long *)((long)reallocated + 8) + (long)(int)str * 8) = 0;
          return 1;
        }
        *(lyext_substmt **)((long)reallocated + 8) = info;
        *(undefined8 *)(*(long *)((long)reallocated + 8) + (long)((int)str + 1) * 8) = 0;
      }
      else if (stmt == LY_STMT_ARGUMENT) {
        info = (lyext_substmt *)realloc(*(void **)((long)reallocated + 8),(long)((int)str + 2));
        if (info == (lyext_substmt *)0x0) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
          *(undefined1 *)(*(long *)((long)reallocated + 8) + (long)(int)str) = 0;
          return 1;
        }
        *(lyext_substmt **)((long)reallocated + 8) = info;
        *(undefined1 *)(*(long *)((long)reallocated + 8) + (long)((int)str + 1)) = 0;
      }
    }
  }
  return 0;
}

Assistant:

int
yang_read_extcomplex_str(struct lys_module *module, struct lys_ext_instance_complex *ext, const char *arg_name,
                         const char *parent_name, char *value, int parent_stmt, LY_STMT stmt)
{
    int c;
    const char **str, ***p = NULL;
    void *reallocated;
    struct lyext_substmt *info;

    c = 0;
    if (stmt == LY_STMT_PREFIX && parent_stmt == LY_STMT_BELONGSTO) {
        /* str contains no NULL value */
        str = lys_ext_complex_get_substmt(LY_STMT_BELONGSTO, ext, &info);
        if (info->cardinality < LY_STMT_CARD_SOME) {
            str++;
        } else {
           /* get the index in the array to add new item */
            p = (const char ***)str;
            for (c = 0; p[0][c + 1]; c++);
            str = p[1];
        }
        str[c] = lydict_insert_zc(module->ctx, value);
    }  else {
        str = lys_ext_complex_get_substmt(stmt, ext, &info);
        if (!str) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }
        if (info->cardinality < LY_STMT_CARD_SOME && *str) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }

        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, str is actually const char *** */
            p = (const char ***)str;
            if (!p[0]) {
                /* allocate initial array */
                p[0] = calloc(2, sizeof(const char *));
                if (stmt == LY_STMT_BELONGSTO) {
                    /* allocate another array for the belongs-to's prefixes */
                    p[1] = calloc(2, sizeof(const char *));
                } else if (stmt == LY_STMT_ARGUMENT) {
                    /* allocate another array for the yin element */
                    ((uint8_t **)p)[1] = calloc(2, sizeof(uint8_t));
                    /* default value of yin element */
                    ((uint8_t *)p[1])[0] = 2;
                }
            } else {
                /* get the index in the array to add new item */
                for (c = 0; p[0][c]; c++);
            }
            str = p[0];
        }

        str[c] = lydict_insert_zc(module->ctx, value);

        if (c) {
            /* enlarge the array(s) */
            reallocated = realloc(p[0], (c + 2) * sizeof(const char *));
            if (!reallocated) {
                LOGMEM;
                lydict_remove(module->ctx, p[0][c]);
                p[0][c] = NULL;
                return EXIT_FAILURE;
            }
            p[0] = reallocated;
            p[0][c + 1] = NULL;

            if (stmt == LY_STMT_BELONGSTO) {
                /* enlarge the second belongs-to's array with prefixes */
                reallocated = realloc(p[1], (c + 2) * sizeof(const char *));
                if (!reallocated) {
                    LOGMEM;
                    lydict_remove(module->ctx, p[1][c]);
                    p[1][c] = NULL;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                p[1][c + 1] = NULL;
            } else if (stmt == LY_STMT_ARGUMENT) {
                /* enlarge the second argument's array with yin element */
                reallocated = realloc(p[1], (c + 2) * sizeof(uint8_t));
                if (!reallocated) {
                    LOGMEM;
                    ((uint8_t *)p[1])[c] = 0;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                ((uint8_t *)p[1])[c + 1] = 0;
            }
        }
    }

    return EXIT_SUCCESS;
}